

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

SignPsbtRequest * __thiscall
cfd::js::api::json::SignPsbtRequest::GetPsbtString_abi_cxx11_
          (SignPsbtRequest *this,SignPsbtRequest *obj)

{
  SignPsbtRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->psbt_);
  return this;
}

Assistant:

static std::string GetPsbtString(  // line separate
      const SignPsbtRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.psbt_);
  }